

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::basic_csv_cursor<char,jsoncons::string_source<char>,std::allocator<char>>::
basic_csv_cursor<std::__cxx11::string_const&>
          (void *param_1,undefined8 param_2,string *param_3,basic_staj_visitor<char> *param_4)

{
  undefined1 auVar1 [16];
  basic_string_view<char,_std::char_traits<char>_> sv;
  allocator<char> *in_stack_000001f8;
  function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *in_stack_00000200;
  basic_csv_decode_options<char> *in_stack_00000208;
  basic_csv_parser<char,_std::allocator<char>_> *in_stack_00000210;
  text_source_adaptor<jsoncons::string_source<char>_> *in_stack_ffffffffffffff50;
  string_view_type in_stack_ffffffffffffff98;
  
  ser_context::ser_context((ser_context *)((long)param_1 + 0x288));
  basic_staj_cursor<char>::basic_staj_cursor((basic_staj_cursor<char> *)param_1);
  *(undefined8 *)param_1 = 0x1339650;
  *(undefined8 *)((long)param_1 + 0x288) = 0x13396f0;
  text_source_adaptor<jsoncons::string_source<char>_>::text_source_adaptor
            (in_stack_ffffffffffffff50);
  std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::function
            ((function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)param_4,
             (function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)
             ((long)param_1 + 0x28));
  basic_csv_parser<char,_std::allocator<char>_>::basic_csv_parser
            (in_stack_00000210,in_stack_00000208,in_stack_00000200,in_stack_000001f8);
  std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::~function
            ((function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)0x42a383);
  basic_staj_visitor<char>::basic_staj_visitor(param_4);
  basic_csv_parser<char,_std::allocator<char>_>::cursor_mode
            ((basic_csv_parser<char,_std::allocator<char>_> *)((long)param_1 + 0x28),true);
  auVar1 = std::__cxx11::string::operator_cast_to_basic_string_view(param_3);
  basic_csv_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_>::
  initialize_with_string_view(auVar1._8_8_,in_stack_ffffffffffffff98,auVar1._0_8_);
  return;
}

Assistant:

basic_csv_cursor(std::allocator_arg_t, const Allocator& alloc, 
        Sourceable&& source, 
        const basic_csv_decode_options<CharT>& options,
        std::function<bool(csv_errc,const ser_context&)> err_handler,
        std::error_code& ec,
        typename std::enable_if<std::is_constructible<jsoncons::basic_string_view<CharT>,Sourceable>::value>::type* = 0)
       : source_(),
         parser_(options,err_handler,alloc)
    {
        parser_.cursor_mode(true);
        jsoncons::basic_string_view<CharT> sv(std::forward<Sourceable>(source));
        initialize_with_string_view(sv, ec);
    }